

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

void DeviceZXSpectrum8192(CDevice **dev,CDevice *parent,aint ramtop)

{
  CDevice *device;
  char *pcVar1;
  aint in_R8D;
  
  device = (CDevice *)operator_new(0x2838);
  device->Next = (CDevice *)0x0;
  device->SlotsCount = 0;
  device->PagesCount = 0;
  device->Memory = (byte *)0x0;
  device->ZxRamTop = 0;
  device->CurrentSlot = 0;
  device->previousSlotI = 0;
  device->previousSlotOpt = O_NONE;
  device->limitExceeded = false;
  pcVar1 = strdup("ZXSPECTRUM8192");
  device->ID = pcVar1;
  if (parent != (CDevice *)0x0) {
    parent->Next = device;
  }
  memset(device->Slots,0,0x2800);
  *dev = device;
  initZxLikeDevice(device,0x200,0x160600,(int *)(ulong)(uint)ramtop,in_R8D);
  return;
}

Assistant:

static void DeviceZXSpectrum8192(CDevice **dev, CDevice *parent, aint ramtop) {
	*dev = new CDevice("ZXSPECTRUM8192", parent);
	initZxLikeDevice(*dev, 0x4000, 512, initialPagesZx128, ramtop);
}